

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementShellANCF_3833 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer pLVar11;
  PointerType pdVar12;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  ChKblockGeneric *pCVar38;
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar39;
  long lVar40;
  double dVar41;
  double dVar42;
  assign_op<double,_double> *paVar43;
  long lVar44;
  Matrix<double,_9,_9,_1,_9,_9> *pMVar45;
  ChElementShellANCF_3833 *pCVar46;
  ChElementShellANCF_3833 *this_00;
  double dVar47;
  Index outer;
  long lVar48;
  ActualDstType actualDst;
  long lVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ActualDstType actualDst_1;
  ActualDstType actualDst_2;
  ChMatrixNM<double,_6,_6> D;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_3,_3> D33;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  DstEvaluatorType dstEvaluator_1;
  MatrixNx3c Sxi_D_0xi;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNxN scale;
  MatrixNx3c Sxi_D;
  add_assign_op<double,_double> local_2f89;
  ChElementShellANCF_3833 *local_2f88;
  undefined1 *local_2f80;
  Matrix<double,__1,__1,_0,__1,__1> *local_2f78;
  assign_op<double,_double> *local_2f70;
  Matrix<double,__1,__1,_0,__1,__1> *local_2f68;
  undefined1 local_2f60 [96];
  pointer local_2f00;
  pointer local_2ef8;
  pointer local_2ef0;
  Scalar local_2ee8;
  Scalar local_2ee0;
  Scalar local_2ed8;
  pointer local_2ed0;
  pointer local_2ec8;
  pointer local_2ec0;
  Scalar local_2eb8;
  Scalar local_2eb0;
  Scalar local_2ea8;
  double local_2ea0;
  double local_2e98;
  double local_2e90;
  Scalar local_2e88;
  Scalar local_2e80;
  Scalar local_2e78;
  double local_2e70;
  double local_2e68;
  double local_2e60;
  Scalar local_2e58;
  Scalar local_2e50;
  Scalar local_2e48 [2];
  undefined1 local_2e38 [24];
  variable_if_dynamic<long,__1> local_2e20;
  variable_if_dynamic<long,__1> local_2e18;
  variable_if_dynamic<long,__1> local_2e10;
  double local_2e08;
  Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> local_2e00;
  double local_2df8;
  double local_2df0;
  double local_2de8;
  double local_2de0;
  Matrix3xN *local_2dd8;
  double local_2dd0;
  double local_2dc8;
  double local_2dc0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  *local_2db8;
  double *local_2db0;
  double local_2da8;
  double local_2da0;
  double local_2d98;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_2d90;
  undefined1 local_2d70 [56];
  double dStack_2d38;
  double dStack_2d30;
  double dStack_2d28;
  double dStack_2d20;
  double dStack_2d18;
  double dStack_2d10;
  double dStack_2d08;
  double local_2d00;
  Matrix<double,_3,_3,_1,_3,_3> local_2cf0;
  Matrix<double,_3,_3,_1,_3,_3> local_2ca8;
  Matrix<double,_3,_3,_1,_3,_3> local_2c60;
  DstEvaluatorType local_2c18;
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [128];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined1 local_2a40 [64];
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  undefined1 local_2980 [16];
  scalar_constant_op<double> local_2970;
  DstXprType *local_2968;
  assign_op<double,_double> *local_2960;
  Matrix<double,_3,_3,_1,_3,_3> *local_2958;
  RhsNested local_2950;
  assign_op<double,_double> *local_2948;
  Matrix<double,_3,_3,_1,_3,_3> *local_2940;
  RhsNested local_2938;
  Matrix<double,_9,_9,_1,_9,_9> *local_2930;
  assign_op<double,_double> *local_2928;
  Matrix<double,_3,_3,_1,_3,_3> *local_2920;
  RhsNested local_2918;
  Matrix<double,_9,_9,_1,_9,_9> local_1748;
  undefined1 local_14c0 [128];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  Matrix<double,_9,_9,_1,_9,_9> local_2c0;
  
  local_2f68 = &this->m_O1;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_2f68,0x51000,0x240,0x240);
  local_2db8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                *)&this->m_O2;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_2db8,0x51000,0x240,0x240);
  local_2f78 = &this->m_K3Compact;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_2f78,0x240,0x18,0x18);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K13Compact,0x240,0x18,0x18);
  local_2980._0_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows;
  local_2980._8_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_cols;
  local_2970.m_other = 0.0;
  if (-1 < (long)(local_2980._8_8_ | local_2980._0_8_)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->m_K13Compact,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_2980,(assign_op<double,_double> *)local_14c0);
    local_2980._0_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows;
    local_2980._8_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols;
    local_2970.m_other = 0.0;
    if (-1 < (long)(local_2980._8_8_ | local_2980._0_8_)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_2f78,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_2980,(assign_op<double,_double> *)local_14c0);
      local_2980._0_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_2980._8_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_2970.m_other = 0.0;
      if (-1 < (long)(local_2980._8_8_ | local_2980._0_8_)) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (local_2f68,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_2980,(assign_op<double,_double> *)local_14c0);
        local_2f88 = this;
        if (this->m_numLayers != 0) {
          local_2dd8 = &this->m_ebar0;
          dVar41 = 0.0;
          do {
            pLVar11 = (this->m_layers).
                      super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_2dc8 = pLVar11[(long)dVar41].m_thickness;
            local_2dd0 = local_2dc8 * 0.5 +
                         ((this->m_layer_zoffsets).
                          super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)dVar41] - this->m_thicknessZ * 0.5)
                         + this->m_midsurfoffset;
            lVar40 = (long)pLVar11[(long)dVar41].m_material.
                           super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
            this_00 = (ChElementShellANCF_3833 *)
                      pLVar11[(long)dVar41].m_material.
                      super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            pCVar46 = (ChElementShellANCF_3833 *)local_2f60;
            local_2de8 = dVar41;
            if (this_00 == (ChElementShellANCF_3833 *)0x0) {
              memcpy((ChElementShellANCF_3833 *)local_2f60,(void *)(lVar40 + 0x20),0x120);
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pCVar38 = (ChKblockGeneric *)
                          ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
                *(int *)&(pCVar38->super_ChKblock)._vptr_ChKblock =
                     *(int *)&(pCVar38->super_ChKblock)._vptr_ChKblock + 1;
                UNLOCK();
              }
              else {
                pCVar38 = (ChKblockGeneric *)
                          ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
                *(int *)&(pCVar38->super_ChKblock)._vptr_ChKblock =
                     *(int *)&(pCVar38->super_ChKblock)._vptr_ChKblock + 1;
              }
              memcpy((ChElementShellANCF_3833 *)local_2f60,(void *)(lVar40 + 0x20),0x120);
              if (this_00 != (ChElementShellANCF_3833 *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
                pCVar46 = this_00;
              }
            }
            RotateReorderStiffnessMatrix
                      (pCVar46,(ChMatrixNM<double,_6,_6> *)local_2f60,
                       (local_2f88->m_layers).
                       super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar41].m_theta);
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[0] = (double)local_2f60._0_8_;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[4] = (double)local_2f60._48_8_;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] = (double)local_2f00;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[3] = local_2e70;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[1] = local_2e70;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[6] = local_2ea0;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[2] = local_2ea0;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[7] = (double)local_2ed0;
            local_2c60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[5] = (double)local_2ed0;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[0] = (double)local_2f60._8_8_;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[4] = (double)local_2f60._56_8_;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] = (double)local_2ef8;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[3] = local_2e68;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[1] = local_2e68;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[6] = local_2e98;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[2] = local_2e98;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[7] = (double)local_2ec8;
            local_2ca8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[5] = (double)local_2ec8;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[0] = (double)local_2f60._16_8_;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[4] = (double)local_2f60._64_8_;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[8] = (double)local_2ef0;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[3] = local_2e60;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[1] = local_2e60;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[6] = local_2e90;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[2] = local_2e90;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[7] = (double)local_2ec0;
            local_2cf0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
            .array[5] = (double)local_2ec0;
            local_2980._0_8_ = &local_1748;
            local_2980._8_8_ = (undefined1 *)0x0;
            local_2970.m_other = 4.94065645841247e-324;
            local_2968 = (DstXprType *)0x1;
            local_1748.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data
            .array[0] = (double)local_2f60._0_8_;
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)
                                 local_2980,(Scalar *)(local_2f60 + 0x28));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x20));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x28));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 8));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x18));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x20));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x18));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x10));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e70);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,local_2e48);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e50);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,local_2e48);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e68);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e58);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e50);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e58);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e60);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ea0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e78);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e80);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e78);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e98);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e88);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e80);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e88);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e90);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e70);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,local_2e48);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e50);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,local_2e48);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e68);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e58);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e50);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e58);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e60);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x30));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x58));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x50));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x58));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x38));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x48));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x50));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x48));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)(local_2f60 + 0x40));
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ed0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ea8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ea8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ec8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ec0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ea0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e78);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e80);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e78);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e98);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e88);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e80);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e88);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2e90);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ed0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ea8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ea8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ec8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2eb8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ec0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2f00);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ed8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ee0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ed8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,(Scalar *)&local_2ef8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ee8);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ee0);
            pCVar39 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                                (pCVar39,&local_2ee8);
            Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                      (pCVar39,(Scalar *)&local_2ef0);
            if (((undefined1 *)
                 ((long)(local_2968->
                        super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.
                        m_data.array + local_2980._8_8_) != (undefined1 *)0x9) ||
               ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                 *)local_2970.m_other !=
                (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                 *)0x9)) {
              __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                            ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 9, 9, 1>>::finished() [MatrixType = Eigen::Matrix<double, 9, 9, 1>]"
                           );
            }
            this = local_2f88;
            if (*(long *)(DAT_00b92cf0 + 0x38) != *(long *)(DAT_00b92cf0 + 0x30)) {
              dVar41 = 0.0;
              do {
                if (*(long *)(DAT_00b92cf0 + 0x38) != *(long *)(DAT_00b92cf0 + 0x30)) {
                  dVar42 = 0.0;
                  local_2df8 = dVar41;
                  do {
                    lVar40 = *(long *)(DAT_00b92cf0 + 0x18);
                    if (*(long *)(DAT_00b92cf0 + 0x20) != lVar40) {
                      dVar47 = 0.0;
                      local_2df0 = dVar42;
                      do {
                        local_2f80 = (undefined1 *)
                                     (*(double *)
                                       (*(long *)(static_tables_3833 + 0x30) + (long)dVar41 * 8) *
                                      *(double *)
                                       (*(long *)(static_tables_3833 + 0x30) + (long)local_2df0 * 8)
                                     * *(double *)
                                        (*(long *)(static_tables_3833 + 0x18) + (long)dVar47 * 8));
                        local_2de0 = dVar47;
                        Calc_Sxi_D(this,(MatrixNx3c *)&local_2c0,
                                   *(double *)(*(long *)(DAT_00b92cf0 + 0x30) + (long)dVar41 * 8),
                                   *(double *)
                                    (*(long *)(DAT_00b92cf0 + 0x30) + (long)local_2df0 * 8),
                                   *(double *)(lVar40 + (long)dVar47 * 8),local_2dc8,local_2dd0);
                        local_2d70._48_8_ = 0.0;
                        dStack_2d38 = 0.0;
                        dStack_2d30 = 0.0;
                        dStack_2d28 = 0.0;
                        dStack_2d20 = 0.0;
                        dStack_2d18 = 0.0;
                        dStack_2d10 = 0.0;
                        dStack_2d08 = 0.0;
                        local_2d00 = 0.0;
                        local_2980._0_8_ = 0x3ff0000000000000;
                        Eigen::internal::
                        generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                        ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
                                  ((Matrix<double,_3,_3,_1,_3,_3> *)(local_2d70 + 0x30),local_2dd8,
                                   (Matrix<double,_24,_3,_0,_24,_3> *)&local_2c0,
                                   (Scalar *)local_2980);
                        local_14c0._8_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(local_2d70 + 0x30);
                        local_14c0._0_8_ = &local_2c0;
                        local_2980._0_8_ = &local_2c0;
                        Eigen::internal::
                        Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                        ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_2980 + 8),
                              (SrcXprType *)(local_14c0 + 8),(assign_op<double,_double> *)local_2bc0
                             );
                        local_2930 = (Matrix<double,_9,_9,_1,_9,_9> *)local_2980._0_8_;
                        auVar50._8_8_ = 0;
                        auVar50._0_8_ = local_2980._8_8_;
                        auVar51 = vbroadcastsd_avx512f(auVar50);
                        auVar52 = vmulpd_avx512f(auVar51,*(undefined1 (*) [64])local_2980._0_8_);
                        auVar1._8_8_ = 0;
                        auVar1._0_8_ = local_2960;
                        auVar53 = vbroadcastsd_avx512f(auVar1);
                        auVar57 = *(undefined1 (*) [64])(local_2980._0_8_ + 0x180);
                        auVar52 = vfmadd231pd_avx512f(auVar52,*(undefined1 (*) [64])
                                                               (local_2980._0_8_ + 0xc0),auVar53);
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = local_2948;
                        auVar54 = vbroadcastsd_avx512f(auVar2);
                        local_2bc0._0_64_ = vfmadd231pd_avx512f(auVar52,auVar57,auVar54);
                        auVar55 = vmulpd_avx512f(auVar51,*(undefined1 (*) [64])
                                                          (local_2980._0_8_ + 0x40));
                        auVar52 = *(undefined1 (*) [64])(local_2980._0_8_ + 0x1c0);
                        auVar55 = vfmadd231pd_avx512f(auVar55,*(undefined1 (*) [64])
                                                               (local_2980._0_8_ + 0x100),auVar53);
                        local_2bc0._64_64_ = vfmadd231pd_avx512f(auVar55,auVar52,auVar54);
                        auVar55 = vmulpd_avx512f(auVar51,*(undefined1 (*) [64])
                                                          (local_2980._0_8_ + 0x80));
                        auVar51 = *(undefined1 (*) [64])(local_2980._0_8_ + 0x200);
                        auVar53 = vfmadd231pd_avx512f(auVar55,*(undefined1 (*) [64])
                                                               (local_2980._0_8_ + 0x140),auVar53);
                        local_2b40 = vfmadd231pd_avx512f(auVar53,auVar51,auVar54);
                        auVar3._8_8_ = 0;
                        auVar3._0_8_ = local_2970.m_other;
                        auVar53 = vbroadcastsd_avx512f(auVar3);
                        auVar4._8_8_ = 0;
                        auVar4._0_8_ = local_2958;
                        auVar54 = vbroadcastsd_avx512f(auVar4);
                        auVar55 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])local_2980._0_8_);
                        auVar55 = vfmadd231pd_avx512f(auVar55,auVar54,
                                                      *(undefined1 (*) [64])
                                                       (local_2980._0_8_ + 0xc0));
                        auVar5._8_8_ = 0;
                        auVar5._0_8_ = local_2940;
                        auVar56 = vbroadcastsd_avx512f(auVar5);
                        local_2b00 = vfmadd231pd_avx512f(auVar55,auVar57,auVar56);
                        auVar55 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])
                                                          (local_2980._0_8_ + 0x40));
                        auVar55 = vfmadd231pd_avx512f(auVar55,auVar54,
                                                      *(undefined1 (*) [64])
                                                       (local_2980._0_8_ + 0x100));
                        local_2ac0 = vfmadd231pd_avx512f(auVar55,auVar52,auVar56);
                        auVar53 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])
                                                          (local_2980._0_8_ + 0x80));
                        auVar53 = vfmadd231pd_avx512f(auVar53,*(undefined1 (*) [64])
                                                               (local_2980._0_8_ + 0x140),auVar54);
                        local_2a80 = vfmadd231pd_avx512f(auVar53,auVar51,auVar56);
                        auVar6._8_8_ = 0;
                        auVar6._0_8_ = local_2968;
                        auVar53 = vbroadcastsd_avx512f(auVar6);
                        auVar7._8_8_ = 0;
                        auVar7._0_8_ = local_2950.m_matrix;
                        auVar54 = vbroadcastsd_avx512f(auVar7);
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = local_2938.m_matrix;
                        auVar55 = vbroadcastsd_avx512f(auVar8);
                        auVar56 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])local_2980._0_8_);
                        auVar56 = vfmadd231pd_avx512f(auVar56,auVar54,
                                                      *(undefined1 (*) [64])
                                                       (local_2980._0_8_ + 0xc0));
                        local_2a40 = vfmadd231pd_avx512f(auVar56,auVar55,auVar57);
                        auVar57 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])
                                                          (local_2980._0_8_ + 0x40));
                        auVar57 = vfmadd231pd_avx512f(auVar57,auVar54,
                                                      *(undefined1 (*) [64])
                                                       (local_2980._0_8_ + 0x100));
                        local_2a00 = vfmadd231pd_avx512f(auVar57,auVar55,auVar52);
                        auVar57 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])
                                                          (local_2980._0_8_ + 0x80));
                        auVar57 = vfmadd231pd_avx512f(auVar57,auVar54,
                                                      *(undefined1 (*) [64])
                                                       (local_2980._0_8_ + 0x140));
                        local_29c0 = vfmadd231pd_avx512f(auVar57,auVar51,auVar55);
                        auVar58._8_8_ = 0;
                        auVar58._0_8_ = dStack_2d28;
                        auVar60._8_8_ = 0;
                        auVar60._0_8_ = dStack_2d20;
                        auVar62._8_8_ = 0;
                        auVar62._0_8_ = local_2d00;
                        auVar64._8_8_ = 0;
                        auVar64._0_8_ = dStack_2d08;
                        auVar65._8_8_ = 0;
                        auVar65._0_8_ = dStack_2d08 * dStack_2d18;
                        auVar50 = vfmsub231sd_fma(auVar65,auVar60,auVar62);
                        auVar63._8_8_ = 0;
                        auVar63._0_8_ = dStack_2d10 * dStack_2d18;
                        auVar1 = vfmsub231sd_fma(auVar63,auVar58,auVar62);
                        auVar61._8_8_ = 0;
                        auVar61._0_8_ = dStack_2d10 * dStack_2d20;
                        auVar2 = vfmsub231sd_fma(auVar61,auVar58,auVar64);
                        auVar14._8_8_ = 0x8000000000000000;
                        auVar14._0_8_ = 0x8000000000000000;
                        auVar59._8_8_ = 0;
                        auVar59._0_8_ =
                             auVar2._0_8_ * dStack_2d30 +
                             (auVar50._0_8_ * (double)local_2d70._48_8_ - auVar1._0_8_ * dStack_2d38
                             );
                        auVar50 = vxorpd_avx512vl(auVar59,auVar14);
                        local_2d70._32_8_ = auVar50._0_8_ * (double)local_2f80;
                        local_2d70._40_8_ = 0.0;
                        local_2970.m_other = (double)local_2d70._32_8_ * 0.5;
                        local_2958 = &local_2c60;
                        local_2940 = &local_2ca8;
                        local_2920 = &local_2cf0;
                        local_2960 = (assign_op<double,_double> *)local_2bc0;
                        local_2950.m_matrix = (non_const_type)local_2bc0;
                        local_2948 = (assign_op<double,_double> *)local_2bc0;
                        local_2938.m_matrix = (non_const_type)local_2bc0;
                        local_2928 = (assign_op<double,_double> *)local_2bc0;
                        local_2918.m_matrix = (non_const_type)local_2bc0;
                        Eigen::internal::
                        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,24,1,24,24>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,24,3,0,24,3>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,24,3,0,24,3>>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,24,3,0,24,3>>,0>const>const>,Eigen::internal::add_assign_op<double,double>>
                                  (local_2f78,
                                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_0>_>_>
                                    *)local_2980,(add_assign_op<double,_double> *)local_14c0);
                        auVar9._8_8_ = 0;
                        auVar9._0_8_ = local_2d70._32_8_;
                        local_2c00 = vbroadcastsd_avx512f(auVar9);
                        dVar41 = 0.0;
                        local_2f70 = (assign_op<double,_double> *)local_2bc0;
                        do {
                          local_2da8 = (double)((long)dVar41 * 3);
                          local_2db0 = local_1748.
                                       super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                       m_storage.m_data.array + (long)dVar41 * 0x1b;
                          dVar42 = 0.0;
                          local_2dc0 = dVar41;
                          do {
                            local_2e10.m_value = (long)dVar42 * 3;
                            local_2e38._8_8_ = local_2db0 + (long)dVar42 * 3;
                            local_2e38._0_8_ = local_2bc0;
                            local_2e20.m_value = (long)&local_1748;
                            local_2e18.m_value = (long)local_2da8;
                            local_2e08 = 4.44659081257122e-323;
                            local_2e00.m_matrix = (non_const_type)local_2e38._0_8_;
                            local_2da0 = dVar42;
                            memset((Matrix<double,_24,_24,_1,_24,_24> *)local_2980,0,0x1200);
                            local_2d70._0_8_ = 1.0;
                            Eigen::internal::
                            generic_product_impl<Eigen::Product<Eigen::Matrix<double,24,3,0,24,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,24,3,0,24,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                            ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
                                      ((Matrix<double,_24,_24,_1,_24,_24> *)local_2980,
                                       (Product<Eigen::Matrix<double,_24,_3,_0,_24,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                                        *)local_2e38,&local_2e00,(Scalar *)local_2d70);
                            lVar40 = 0x80;
                            do {
                              uVar15 = *(undefined8 *)(local_2a00 + lVar40 + 8);
                              uVar16 = *(undefined8 *)(local_2a00 + lVar40 + 0x10);
                              uVar17 = *(undefined8 *)(local_2a00 + lVar40 + 0x18);
                              uVar18 = *(undefined8 *)(local_2a00 + lVar40 + 0x20);
                              uVar19 = *(undefined8 *)(local_2a00 + lVar40 + 0x28);
                              uVar20 = *(undefined8 *)(local_2a00 + lVar40 + 0x30);
                              uVar21 = *(undefined8 *)(local_2a00 + lVar40 + 0x38);
                              uVar22 = *(undefined8 *)(local_29c0 + lVar40);
                              uVar23 = *(undefined8 *)(local_29c0 + lVar40 + 8);
                              uVar24 = *(undefined8 *)(local_29c0 + lVar40 + 0x10);
                              uVar25 = *(undefined8 *)(local_29c0 + lVar40 + 0x18);
                              uVar26 = *(undefined8 *)(local_29c0 + lVar40 + 0x20);
                              uVar27 = *(undefined8 *)(local_29c0 + lVar40 + 0x28);
                              uVar28 = *(undefined8 *)(local_29c0 + lVar40 + 0x30);
                              uVar29 = *(undefined8 *)(local_29c0 + lVar40 + 0x38);
                              uVar30 = *(undefined8 *)(local_2980 + lVar40);
                              uVar31 = *(undefined8 *)(local_2980 + lVar40 + 8);
                              uVar32 = *(undefined8 *)((long)&local_2970.m_other + lVar40);
                              uVar33 = *(undefined8 *)((long)&local_2968 + lVar40);
                              uVar34 = *(undefined8 *)((long)&local_2960 + lVar40);
                              uVar35 = *(undefined8 *)((long)&local_2958 + lVar40);
                              uVar36 = *(undefined8 *)((long)&local_2950.m_matrix + lVar40);
                              uVar37 = *(undefined8 *)((long)&local_2948 + lVar40);
                              *(undefined8 *)(local_14c0 + lVar40 + -0x80) =
                                   *(undefined8 *)(local_2a00 + lVar40);
                              *(undefined8 *)(local_14c0 + lVar40 + -0x78) = uVar15;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x70) = uVar16;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x68) = uVar17;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x60) = uVar18;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x58) = uVar19;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x50) = uVar20;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x48) = uVar21;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x40) = uVar22;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x38) = uVar23;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x30) = uVar24;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x28) = uVar25;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x20) = uVar26;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x18) = uVar27;
                              *(undefined8 *)(local_14c0 + lVar40 + -0x10) = uVar28;
                              *(undefined8 *)(local_14c0 + lVar40 + -8) = uVar29;
                              *(undefined8 *)(local_14c0 + lVar40) = uVar30;
                              *(undefined8 *)(local_14c0 + lVar40 + 8) = uVar31;
                              *(undefined8 *)(local_14c0 + lVar40 + 0x10) = uVar32;
                              *(undefined8 *)(local_14c0 + lVar40 + 0x18) = uVar33;
                              *(undefined8 *)(local_14c0 + lVar40 + 0x20) = uVar34;
                              *(undefined8 *)(local_14c0 + lVar40 + 0x28) = uVar35;
                              *(undefined8 *)(local_14c0 + lVar40 + 0x30) = uVar36;
                              *(undefined8 *)(local_14c0 + lVar40 + 0x38) = uVar37;
                              lVar40 = lVar40 + 0xc0;
                            } while (lVar40 != 0x1280);
                            local_2e38._0_8_ = local_2d70._32_8_;
                            local_2d70._0_8_ = local_14c0;
                            local_2980._0_8_ = local_2d70;
                            local_2980._8_8_ = local_2e38;
                            local_14c0._0_64_ = vmulpd_avx512f(local_2c00,local_14c0._0_64_);
                            local_14c0._64_64_ = vmulpd_avx512f(local_2c00,local_14c0._64_64_);
                            local_1440 = vmulpd_avx512f(local_2c00,local_1440);
                            local_1400 = vmulpd_avx512f(local_2c00,local_1400);
                            local_13c0 = vmulpd_avx512f(local_2c00,local_13c0);
                            local_1380 = vmulpd_avx512f(local_2c00,local_1380);
                            local_1340 = vmulpd_avx512f(local_2c00,local_1340);
                            local_1300 = vmulpd_avx512f(local_2c00,local_1300);
                            local_12c0 = vmulpd_avx512f(local_2c00,local_12c0);
                            local_1280 = vmulpd_avx512f(local_2c00,local_1280);
                            local_1240 = vmulpd_avx512f(local_2c00,local_1240);
                            local_1200 = vmulpd_avx512f(local_2c00,local_1200);
                            local_11c0 = vmulpd_avx512f(local_2c00,local_11c0);
                            local_1180 = vmulpd_avx512f(local_2c00,local_1180);
                            local_2970.m_other = (double)&local_2d90;
                            local_2968 = (DstXprType *)local_2d70._0_8_;
                            Eigen::internal::
                            copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
                            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                                   *)local_2980);
                            lVar40 = (long)dVar42 * 0xc0;
                            auVar57 = *(undefined1 (*) [64])(local_2bc0 + lVar40);
                            auVar52 = *(undefined1 (*) [64])(local_2bc0 + lVar40 + 0x40);
                            auVar51 = *(undefined1 (*) [64])(local_2b40 + lVar40);
                            lVar40 = 0x10;
                            paVar43 = local_2f70;
                            do {
                              auVar10._8_8_ = 0;
                              auVar10._0_8_ = *(ulong *)paVar43;
                              auVar53 = vbroadcastsd_avx512f(auVar10);
                              auVar54 = vmulpd_avx512f(auVar57,auVar53);
                              *(undefined1 (*) [64])(local_2a00 + lVar40 * 8) = auVar54;
                              auVar54 = vmulpd_avx512f(auVar53,auVar52);
                              *(undefined1 (*) [64])(local_29c0 + lVar40 * 8) = auVar54;
                              auVar53 = vmulpd_avx512f(auVar53,auVar51);
                              *(undefined1 (*) [64])(local_2980 + lVar40 * 8) = auVar53;
                              lVar40 = lVar40 + 0x18;
                              paVar43 = paVar43 + 8;
                            } while (lVar40 != 0x250);
                            dVar41 = 0.0;
                            do {
                              local_2f80 = local_14c0 + (long)dVar41 * 8;
                              dVar42 = (double)((long)dVar41 * 0x18);
                              lVar40 = 0;
                              local_2d98 = dVar41;
                              do {
                                local_2e20.m_value = lVar40 * 0x18;
                                local_2e10.m_value =
                                     (local_2f88->m_O1).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_rows;
                                local_2e38._0_8_ =
                                     (local_2f88->m_O1).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data +
                                     lVar40 * 0x18 + local_2e10.m_value * (long)dVar42;
                                local_2e38._16_8_ = local_2f68;
                                local_2e18.m_value = (long)dVar42;
                                if ((local_2e10.m_value < lVar40 * 0x18 + 0x18) ||
                                   ((local_2f88->m_O1).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols < (long)dVar41 * 0x18 + 0x18))
                                goto LAB_0077bb1d;
                                local_2d70._24_8_ = local_2980;
                                local_2d90.m_dst = &local_2c18;
                                local_2d90.m_src = (SrcEvaluatorType *)local_2d70;
                                local_2d90.m_functor = &local_2f89;
                                local_2d90.m_dstExpr = (DstXprType *)local_2e38;
                                lVar48 = 0;
                                local_2d70._8_8_ = *(double *)(local_2f80 + lVar40 * 0xc0);
                                local_2c18.
                                super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false,_true>
                                .
                                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>,_Eigen::Matrix<double,_24,_24,_0,_24,_24>_>
                                .m_data = (PointerType)local_2e38._0_8_;
                                local_2c18.
                                super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false,_true>
                                .
                                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>,_Eigen::Matrix<double,_24,_24,_0,_24,_24>_>
                                .m_outerStride.m_value = local_2e10.m_value;
                                do {
                                  pdVar12 = ((local_2d90.m_dst)->
                                            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false,_true>
                                            ).
                                            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>,_Eigen::Matrix<double,_24,_24,_0,_24,_24>_>
                                            .m_data;
                                  lVar44 = ((local_2d90.m_dst)->
                                           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false,_true>
                                           ).
                                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>,_Eigen::Matrix<double,_24,_24,_0,_24,_24>_>
                                           .m_outerStride.m_value * lVar48;
                                  pdVar13 = ((local_2d90.m_src)->
                                            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                            ).m_d.rhsImpl.
                                            super_evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                            .
                                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                            .m_d.data;
                                  pdVar12[lVar44] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48] + pdVar12[lVar44];
                                  pdVar12[lVar44 + 1] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48 + 0x18] +
                                       pdVar12[lVar44 + 1];
                                  pdVar12[lVar44 + 2] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48 + 0x30] +
                                       pdVar12[lVar44 + 2];
                                  pdVar12[lVar44 + 3] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48 + 0x48] +
                                       pdVar12[lVar44 + 3];
                                  pdVar12[lVar44 + 4] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48 + 0x60] +
                                       pdVar12[lVar44 + 4];
                                  pdVar12[lVar44 + 5] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48 + 0x78] +
                                       pdVar12[lVar44 + 5];
                                  pdVar12[lVar44 + 6] =
                                       ((local_2d90.m_src)->
                                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                       ).m_d.lhsImpl.
                                       super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
                                       .m_functor.m_other * pdVar13[lVar48 + 0x90] +
                                       pdVar12[lVar44 + 6];
                                  Eigen::internal::
                                  copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_7,_24>
                                  ::run(&local_2d90,lVar48);
                                  lVar48 = lVar48 + 1;
                                } while (lVar48 != 0x18);
                                lVar40 = lVar40 + 1;
                              } while (lVar40 != 0x18);
                              dVar41 = (double)((long)local_2d98 + 1);
                            } while (dVar41 != 1.18575755001899e-322);
                            dVar42 = (double)((long)local_2da0 + 1);
                          } while (dVar42 != 1.48219693752374e-323);
                          dVar41 = (double)((long)local_2dc0 + 1);
                          local_2f70 = local_2f70 + 0xc0;
                        } while (dVar41 != 1.48219693752374e-323);
                        dVar47 = (double)(ulong)(SUB84(local_2de0,0) + 1);
                        lVar40 = *(long *)(DAT_00b92cf0 + 0x18);
                        this = local_2f88;
                        dVar41 = local_2df8;
                        dVar42 = local_2df0;
                      } while ((ulong)dVar47 < (ulong)(*(long *)(DAT_00b92cf0 + 0x20) - lVar40 >> 3)
                              );
                    }
                    dVar42 = (double)(ulong)(SUB84(dVar42,0) + 1);
                  } while ((ulong)dVar42 <
                           (ulong)(*(long *)(DAT_00b92cf0 + 0x38) - *(long *)(DAT_00b92cf0 + 0x30)
                                  >> 3));
                }
                dVar41 = (double)(ulong)(SUB84(dVar41,0) + 1);
              } while ((ulong)dVar41 <
                       (ulong)(*(long *)(DAT_00b92cf0 + 0x38) - *(long *)(DAT_00b92cf0 + 0x30) >> 3)
                      );
            }
            dVar41 = (double)((long)local_2de8 + 1);
          } while ((ulong)dVar41 < (ulong)(long)this->m_numLayers);
        }
        lVar40 = 0;
        local_2f80 = (undefined1 *)0x0;
        do {
          paVar43 = (assign_op<double,_double> *)((long)local_2f80 * 0x18);
          lVar48 = (long)local_2f80 * 0x18 + 0x18;
          lVar44 = 0x18;
          lVar49 = 0;
          do {
            auVar57 = local_14c0._0_64_;
            dVar41 = (double)(this->m_O1).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows;
            if (((long)dVar41 < lVar44) ||
               ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols < lVar48)) {
LAB_0077bb1d:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 24, 24>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 24, BlockCols = 24, InnerPanel = false]"
                           );
            }
            local_2968 = (DstXprType *)(lVar44 + -0x18);
            pdVar13 = (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data;
            local_2958 = (Matrix<double,_3,_3,_1,_3,_3> *)
                         (this->m_O2).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows;
            local_2980._0_8_ = (long)pdVar13 + lVar49 + lVar40 * (long)local_2958;
            local_2970.m_other = (double)local_2db8;
            local_2960 = paVar43;
            if (((long)local_2958 < lVar44) ||
               ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols < lVar48)) goto LAB_0077bb1d;
            pMVar45 = (Matrix<double,_9,_9,_1,_9,_9> *)
                      ((long)(this->m_O1).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data + lVar49 + lVar40 * (long)dVar41);
            if ((pdVar13 != (double *)0x0) &&
               ((Matrix<double,_9,_9,_1,_9,_9> *)local_2980._0_8_ == pMVar45)) {
              __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                            ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                            "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1>, 24, 24>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 24, 24>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 24, 24>, OtherDerived = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 24, 24>>, MightHaveTransposeAliasing = true]"
                           );
            }
            local_14c0._8_8_ = &local_1748;
            local_14c0._0_8_ = &local_2c0;
            local_14c0._16_8_ = local_2bc0;
            local_14c0._32_32_ = auVar57._32_32_;
            local_14c0._24_8_ = (DstXprType *)local_2980;
            local_1748.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data
            .array[0] = (double)pMVar45;
            local_1748.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data
            .array[2] = dVar41;
            local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
            array[0] = (double)local_2980._0_8_;
            local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
            array[2] = (double)local_2958;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_24,_24,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_24,_24,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)local_14c0);
            lVar49 = lVar49 + 0xc0;
            lVar44 = lVar44 + 0x18;
            this = local_2f88;
          } while (lVar44 != 600);
          local_2f80 = local_2f80 + 1;
          lVar40 = lVar40 + 0xc0;
          if (local_2f80 == (undefined1 *)0x18) {
            return;
          }
        } while( true );
      }
    }
  }
  local_2970.m_other = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, PlainObjectType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void ChElementShellANCF_3833::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = NP - 1;  // Gauss-Quadrature table index for xi and eta
    unsigned int GQ_idx_zeta = NT - 1;    // Gauss-Quadrature table index for zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double thickness = m_layers[kl].Get_thickness();
        double layer_midsurface_offset =
            -m_thicknessZ / 2 + m_layer_zoffsets[kl] + m_layers[kl].Get_thickness() / 2 + m_midsurfoffset;

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
        // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
        // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
        // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
        // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
        // =============================================================================
        ChMatrixNM<double, 3, 3> D11;
        ChMatrixNM<double, 3, 3> D22;
        ChMatrixNM<double, 3, 3> D33;
        D11(0, 0) = D(0, 0);
        D11(1, 1) = D(1, 0);
        D11(2, 2) = D(2, 0);
        D11(1, 0) = D(5, 0);
        D11(0, 1) = D(5, 0);
        D11(2, 0) = D(4, 0);
        D11(0, 2) = D(4, 0);
        D11(2, 1) = D(3, 0);
        D11(1, 2) = D(3, 0);

        D22(0, 0) = D(0, 1);
        D22(1, 1) = D(1, 1);
        D22(2, 2) = D(2, 1);
        D22(1, 0) = D(5, 1);
        D22(0, 1) = D(5, 1);
        D22(2, 0) = D(4, 1);
        D22(0, 2) = D(4, 1);
        D22(2, 1) = D(3, 1);
        D22(1, 2) = D(3, 1);

        D33(0, 0) = D(0, 2);
        D33(1, 1) = D(1, 2);
        D33(2, 2) = D(2, 2);
        D33(1, 0) = D(5, 2);
        D33(0, 1) = D(5, 2);
        D33(2, 0) = D(4, 2);
        D33(0, 2) = D(4, 2);
        D33(2, 1) = D(3, 2);
        D33(1, 2) = D(3, 2);

        // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
        ChMatrixNM<double, 9, 9> D_block;
        D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
            D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
            D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
            D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
            D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
            D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
            D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

        // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
        // the internal force calculations
        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];

                    ChMatrix33<double>
                        J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
                    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                    Calc_Sxi_D(Sxi_D, xi, eta, zeta, thickness, layer_midsurface_offset);
                    J_0xi.noalias() = m_ebar0 * Sxi_D;

                    MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                    double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                    m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                                   (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                                    Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

                    MatrixNxN scale;
                    for (unsigned int n = 0; n < 3; n++) {
                        for (unsigned int c = 0; c < 3; c++) {
                            scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                            scale *= GQWeight_det_J_0xi;

                            MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                                Sxi_D_0xi.template block<NSF, 1>(0, n) *
                                Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                            for (unsigned int f = 0; f < NSF; f++) {
                                for (unsigned int t = 0; t < NSF; t++) {
                                    m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                        scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}